

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

bool __thiscall
QPDFObjectHandle::pipeStreamData
          (QPDFObjectHandle *this,Pipeline *p,bool filter,bool normalize,bool compress)

{
  bool bVar1;
  undefined4 local_24;
  undefined4 local_20;
  qpdf_stream_decode_level_e decode_level;
  int encode_flags;
  bool compress_local;
  bool normalize_local;
  bool filter_local;
  Pipeline *p_local;
  QPDFObjectHandle *this_local;
  
  local_20 = 0;
  local_24 = qpdf_dl_none;
  if (filter) {
    local_24 = qpdf_dl_generalized;
    if (normalize) {
      local_20 = 2;
    }
    if (compress) {
      local_20 = local_20 | 1;
    }
  }
  bVar1 = pipeStreamData(this,p,local_20,local_24,false,false);
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::pipeStreamData(Pipeline* p, bool filter, bool normalize, bool compress)
{
    int encode_flags = 0;
    qpdf_stream_decode_level_e decode_level = qpdf_dl_none;
    if (filter) {
        decode_level = qpdf_dl_generalized;
        if (normalize) {
            encode_flags |= qpdf_ef_normalize;
        }
        if (compress) {
            encode_flags |= qpdf_ef_compress;
        }
    }
    return pipeStreamData(p, encode_flags, decode_level, false);
}